

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

SupportVectorRegressor *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::SupportVectorRegressor>
          (Arena *arena)

{
  SupportVectorRegressor *pSVar1;
  
  if (arena != (Arena *)0x0) {
    pSVar1 = DoCreateMessage<CoreML::Specification::SupportVectorRegressor>(arena);
    return pSVar1;
  }
  pSVar1 = (SupportVectorRegressor *)operator_new(0x38);
  CoreML::Specification::SupportVectorRegressor::SupportVectorRegressor(pSVar1,(Arena *)0x0,false);
  return pSVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }